

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimage.cpp
# Opt level: O2

void __thiscall CVmImageLoader::load_entrypt(CVmImageLoader *this,ulong siz)

{
  ulong siz_local;
  char buf [32];
  
  siz_local = siz;
  if ((this->field_0x90 & 4) == 0) {
    read_data(this,buf,0x10,&siz_local);
    this->entrypt_ = buf._0_4_;
    CVmRun::set_funchdr_size(&G_interpreter_X,(ulong)(ushort)buf._4_2_);
    G_exc_entry_size_X = (size_t)(ushort)buf._6_2_;
    G_line_entry_size_X = (size_t)(ushort)buf._8_2_;
    G_dbg_hdr_size_X = (size_t)(ushort)buf._10_2_;
    G_dbg_lclsym_hdr_size_X = (size_t)(ushort)buf._12_2_;
    G_dbg_fmt_vsn_X = (int)(ushort)buf._14_2_;
    G_dbg_frame_size_X = 4;
    if (1 < siz_local) {
      read_data(this,buf,2,&siz_local);
      G_dbg_frame_size_X = (int)(ushort)buf._0_2_;
    }
    this->field_0x90 = this->field_0x90 | 4;
    return;
  }
  err_throw(0x13d);
}

Assistant:

void CVmImageLoader::load_entrypt(VMG_ ulong siz)
{
    char buf[32];
    
    /* if we've already loaded an entrypoint, throw an error */
    if (loaded_entrypt_)
        err_throw(VMERR_IMAGE_ENTRYPT_REDEF);

    /* read the entrypoint offset */
    read_data(buf, 16, &siz);

    /* set the entrypoint */
    entrypt_ = t3rp4u(buf);

    /* set the method header size in the interpreter */
    G_interpreter->set_funchdr_size(osrp2(buf+4));

    /* set the exception table entry size global */
    G_exc_entry_size = osrp2(buf+6);

    /* set the debugger source line record size global */
    G_line_entry_size = osrp2(buf+8);

    /* set the debug table header size */
    G_dbg_hdr_size = osrp2(buf+10);

    /* set the debug local symbol header size */
    G_dbg_lclsym_hdr_size = osrp2(buf+12);

    /* set the debug version ID */
    G_dbg_fmt_vsn = osrp2(buf+14);

    /* set the frame size */
    G_dbg_frame_size = 4;
    if (siz >= 2)
    {
        read_data(buf, 2, &siz);
        G_dbg_frame_size = osrp2(buf);
    }

    /* note that we've loaded it */
    loaded_entrypt_ = TRUE;
}